

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3 *pMP3,ma_dr_mp3d_sample_t *pPCMFrames)

{
  size_t *psVar1;
  size_t szNew;
  byte bVar2;
  int iVar3;
  ma_uint32 mVar4;
  ma_uint8 *pmVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  ma_dr_mp3dec_frame_info info;
  ma_dr_mp3dec_frame_info local_3c;
  
  pmVar5 = (pMP3->memory).pData;
  if ((pmVar5 == (ma_uint8 *)0x0) || (sVar6 = (pMP3->memory).dataSize, sVar6 == 0)) {
    mVar4 = 0;
    if ((pMP3->field_0x3ea0 & 1) == 0) {
      while( true ) {
        uVar9 = pMP3->dataSize;
        if (uVar9 < 0x4000) {
          pmVar5 = pMP3->pData;
          if (pmVar5 == (ma_uint8 *)0x0) {
            pmVar5 = (ma_uint8 *)0x0;
          }
          else {
            memmove(pmVar5,pmVar5 + pMP3->dataConsumed,uVar9);
            pmVar5 = pMP3->pData;
          }
          pMP3->dataConsumed = 0;
          uVar9 = pMP3->dataCapacity;
          if (uVar9 < 0x10000) {
            pmVar5 = (ma_uint8 *)
                     ma_dr_mp3__realloc_from_callbacks
                               (pmVar5,0x10000,uVar9,&pMP3->allocationCallbacks);
            if (pmVar5 == (ma_uint8 *)0x0) {
              return 0;
            }
            pMP3->pData = pmVar5;
            pMP3->dataCapacity = 0x10000;
            uVar9 = 0x10000;
          }
          sVar6 = (*pMP3->onRead)(pMP3->pUserData,pmVar5 + pMP3->dataSize,uVar9 - pMP3->dataSize);
          pMP3->streamCursor = pMP3->streamCursor + sVar6;
          if (sVar6 == 0 && pMP3->dataSize == 0) goto LAB_0015bf79;
          uVar9 = pMP3->dataSize + sVar6;
          pMP3->dataSize = uVar9;
        }
        if (0x7fffffff < uVar9) goto LAB_0015bf79;
        if (pMP3->pData == (ma_uint8 *)0x0) {
          return 0;
        }
        iVar3 = ma_dr_mp3dec_decode_frame
                          (&pMP3->decoder,pMP3->pData + pMP3->dataConsumed,(int)uVar9,pPCMFrames,
                           &local_3c);
        lVar7 = (long)local_3c.frame_bytes;
        if (0 < lVar7) {
          pMP3->dataConsumed = pMP3->dataConsumed + lVar7;
          pMP3->dataSize = pMP3->dataSize - lVar7;
        }
        if (iVar3 != 0) break;
        if (local_3c.frame_bytes == 0) {
          memmove(pMP3->pData,pMP3->pData + pMP3->dataConsumed,pMP3->dataSize);
          pMP3->dataConsumed = 0;
          sVar8 = pMP3->dataSize;
          sVar6 = pMP3->dataCapacity;
          pmVar5 = pMP3->pData;
          if (sVar6 == sVar8) {
            szNew = sVar6 + 0x10000;
            pmVar5 = (ma_uint8 *)
                     ma_dr_mp3__realloc_from_callbacks
                               (pmVar5,szNew,sVar6,&pMP3->allocationCallbacks);
            if (pmVar5 == (ma_uint8 *)0x0) {
              return 0;
            }
            pMP3->pData = pmVar5;
            pMP3->dataCapacity = szNew;
            sVar8 = pMP3->dataSize;
            sVar6 = szNew;
          }
          sVar6 = (*pMP3->onRead)(pMP3->pUserData,pmVar5 + sVar8,sVar6 - sVar8);
          pMP3->streamCursor = pMP3->streamCursor + sVar6;
          if (sVar6 == 0) {
LAB_0015bf79:
            pMP3->field_0x3ea0 = pMP3->field_0x3ea0 | 1;
            return 0;
          }
          pMP3->dataSize = pMP3->dataSize + sVar6;
        }
      }
      bVar2 = (pMP3->decoder).header[1];
      mVar4 = 0x180;
      if ((~bVar2 & 6) != 0) {
        mVar4 = 0x480 >> ((bVar2 & 0xe) == 2);
      }
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = mVar4;
      pMP3->mp3FrameChannels = local_3c.channels;
      pMP3->mp3FrameSampleRate = local_3c.hz;
    }
  }
  else {
    mVar4 = 0;
    if ((pMP3->field_0x3ea0 & 1) == 0) {
      sVar8 = (pMP3->memory).currentReadPos;
      iVar3 = ma_dr_mp3dec_decode_frame
                        (&pMP3->decoder,pmVar5 + sVar8,(int)sVar6 - (int)sVar8,pPCMFrames,&local_3c)
      ;
      if (iVar3 == 0) {
        do {
          if ((long)local_3c.frame_bytes < 1) {
            mVar4 = 0;
            goto LAB_0015bd88;
          }
          sVar6 = (long)local_3c.frame_bytes + (pMP3->memory).currentReadPos;
          (pMP3->memory).currentReadPos = sVar6;
          iVar3 = ma_dr_mp3dec_decode_frame
                            (&pMP3->decoder,(pMP3->memory).pData + sVar6,
                             (int)(pMP3->memory).dataSize - (int)sVar6,pPCMFrames,&local_3c);
        } while (iVar3 == 0);
      }
      bVar2 = (pMP3->decoder).header[1];
      mVar4 = 0x180;
      if ((~bVar2 & 6) != 0) {
        mVar4 = 0x480 >> ((bVar2 & 0xe) == 2);
      }
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = mVar4;
      pMP3->mp3FrameChannels = local_3c.channels;
      pMP3->mp3FrameSampleRate = local_3c.hz;
LAB_0015bd88:
      psVar1 = &(pMP3->memory).currentReadPos;
      *psVar1 = *psVar1 + (long)local_3c.frame_bytes;
    }
  }
  return mVar4;
}

Assistant:

static ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3* pMP3, ma_dr_mp3d_sample_t* pPCMFrames)
{
    if (pMP3->memory.pData != NULL && pMP3->memory.dataSize > 0) {
        return ma_dr_mp3_decode_next_frame_ex__memory(pMP3, pPCMFrames);
    } else {
        return ma_dr_mp3_decode_next_frame_ex__callbacks(pMP3, pPCMFrames);
    }
}